

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O2

int parse_args_DCL(Context_conflict2 *ctx)

{
  RegisterType RVar1;
  int iVar2;
  bool bVar3;
  int *piVar4;
  uint uVar5;
  uint32 uVar6;
  ulong uVar7;
  long lVar8;
  uint32 index;
  
  index = 0;
  ctx->tokenbufpos = ctx->tokenbufpos + 1;
  ctx->tokenbuf[0] = 0;
  piVar4 = &parse_dcl_usage_usagestrs_rel;
  for (uVar7 = 0; uVar7 != 0xe; uVar7 = uVar7 + 1) {
    iVar2 = check_token_segment(ctx,(char *)((long)&parse_dcl_usage_usagestrs_rel + (long)*piVar4));
    if (iVar2 != 0) {
      bVar3 = false;
      goto LAB_001377da;
    }
    piVar4 = piVar4 + 1;
  }
  uVar7 = 2;
  bVar3 = true;
  for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
    iVar2 = check_token_segment(ctx,(char *)((long)&parse_dcl_usage_samplerusagestrs_rel +
                                            (long)*(int *)((long)&
                                                  parse_dcl_usage_samplerusagestrs_rel + lVar8)));
    if (iVar2 != 0) goto LAB_001377da;
    uVar7 = (ulong)((int)uVar7 + 1);
  }
  uVar5 = 0;
  bVar3 = false;
LAB_00137810:
  parse_destination_token(ctx);
  RVar1 = (ctx->dest_arg).regtype;
  if (bVar3 == (RVar1 == REG_TYPE_SAMPLER)) {
    if (RVar1 == REG_TYPE_SAMPLER) {
      uVar6 = (uVar5 | 0xfffffff0) << 0x1b;
    }
    else {
      if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
        ctx->tokenbuf[0] = 0x80000000;
        return 3;
      }
      uVar6 = uVar5 | index << 0x10 | 0x80000000;
    }
    ctx->tokenbuf[0] = uVar6;
  }
  else {
    fail(ctx,"Invalid usage");
  }
  return 3;
LAB_001377da:
  uVar5 = (uint)uVar7;
  if (((ctx->tokenlen != 0) && (*ctx->token != '_')) &&
     (iVar2 = ui32fromtoken(ctx,&index), iVar2 == 0)) {
    fail(ctx,"Expected usage index");
  }
  goto LAB_00137810;
}

Assistant:

static int parse_args_DCL(Context *ctx)
{
    int issampler = 0;
    uint32 usage = 0;
    uint32 index = 0;

    ctx->tokenbufpos++;  // save a spot for the usage/index token.
    ctx->tokenbuf[0] = 0;

    // parse_instruction_token() sets ctx->token to the end of the instruction
    //  so we can see if there are destination modifiers on the instruction
    //  itself...

    if (parse_dcl_usage(ctx, &usage, &issampler))
    {
        if ((ctx->tokenlen > 0) && (*ctx->token != '_'))
        {
            if (!ui32fromtoken(ctx, &index))
                fail(ctx, "Expected usage index");
        } // if
    } // if

    parse_destination_token(ctx);

    const int samplerreg = (ctx->dest_arg.regtype == REG_TYPE_SAMPLER);
    if (issampler != samplerreg)
        fail(ctx, "Invalid usage");
    else if (samplerreg)
        ctx->tokenbuf[0] = (usage << 27) | 0x80000000;
    else if (shader_is_pixel(ctx))  // all other pixel shader types are zero'd.
        ctx->tokenbuf[0] = 0x80000000;
    else
        ctx->tokenbuf[0] = usage | (index << 16) | 0x80000000;

    return 3;
}